

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_scopes.cpp
# Opt level: O0

spv_result_t
spvtools::val::ValidateMemoryScope(ValidationState_t *_,Instruction *inst,uint32_t scope)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  MemoryModel MVar4;
  DiagnosticStream *pDVar5;
  spv_const_context psVar6;
  Function *pFVar7;
  anon_class_32_1_293d74c2 local_930;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_910;
  string local_8f0;
  anon_class_32_1_293d74c2 local_8d0;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_8b0;
  undefined1 local_890 [8];
  string errorVUID_1;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_850;
  undefined1 local_830 [8];
  string errorVUID;
  string local_808;
  DiagnosticStream local_7e8;
  char *local_610;
  string local_608;
  DiagnosticStream local_5e8;
  DiagnosticStream local_410;
  char *local_238;
  DiagnosticStream local_230;
  uint local_58;
  spv_result_t local_54;
  Scope value;
  spv_result_t error;
  tuple<bool,_bool,_unsigned_int> local_38;
  uint local_30;
  bool local_2a;
  bool local_29;
  uint32_t tmp_value;
  bool is_const_int32;
  uint32_t uStack_24;
  bool is_int32;
  Op opcode;
  uint32_t scope_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  uStack_24 = scope;
  _opcode = inst;
  inst_local = (Instruction *)_;
  tmp_value = Instruction::opcode(inst);
  local_29 = false;
  local_2a = false;
  local_30 = 0;
  ValidationState_t::EvalInt32IfConst(&local_38,(ValidationState_t *)inst_local,uStack_24);
  std::tie<bool,bool,unsigned_int>
            ((tuple<bool_&,_bool_&,_unsigned_int_&> *)&value,&local_29,&local_2a,&local_30);
  std::tuple<bool&,bool&,unsigned_int&>::operator=
            ((tuple<bool&,bool&,unsigned_int&> *)&value,&local_38);
  local_54 = ValidateScope((ValidationState_t *)inst_local,_opcode,uStack_24);
  __local._4_4_ = local_54;
  if (local_54 == SPV_SUCCESS) {
    if ((local_2a & 1U) == 0) {
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      local_58 = local_30;
      if (local_30 == 5) {
        bVar2 = ValidationState_t::HasCapability
                          ((ValidationState_t *)inst_local,CapabilityVulkanMemoryModel);
        if (bVar2) {
          __local._4_4_ = SPV_SUCCESS;
        }
        else {
          ValidationState_t::diag
                    (&local_230,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
          local_238 = spvOpcodeString(tmp_value);
          pDVar5 = DiagnosticStream::operator<<(&local_230,&local_238);
          pDVar5 = DiagnosticStream::operator<<
                             (pDVar5,(char (*) [51])
                                     ": Memory Scope QueueFamilyKHR requires capability ");
          pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [21])0x642dff);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          DiagnosticStream::~DiagnosticStream(&local_230);
        }
      }
      else if (((local_30 != 1) ||
               (bVar2 = ValidationState_t::HasCapability
                                  ((ValidationState_t *)inst_local,CapabilityVulkanMemoryModel),
               !bVar2)) ||
              (bVar2 = ValidationState_t::HasCapability
                                 ((ValidationState_t *)inst_local,
                                  CapabilityVulkanMemoryModelDeviceScope), bVar2)) {
        psVar6 = ValidationState_t::context((ValidationState_t *)inst_local);
        bVar2 = spvIsVulkanEnv(psVar6->target_env);
        if (bVar2) {
          if ((((local_58 != 1) && (local_58 != 2)) &&
              ((local_58 != 3 && ((local_58 != 4 && (local_58 != 6)))))) && (local_58 != 5)) {
            ValidationState_t::diag
                      (&local_5e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
            ValidationState_t::VkErrorID_abi_cxx11_
                      (&local_608,(ValidationState_t *)inst_local,0x121e,(char *)0x0);
            pDVar5 = DiagnosticStream::operator<<(&local_5e8,&local_608);
            local_610 = spvOpcodeString(tmp_value);
            pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_610);
            pDVar5 = DiagnosticStream::operator<<
                               (pDVar5,(char (*) [122])
                                       ": in Vulkan environment Memory Scope is limited to Device, QueueFamily, Workgroup, ShaderCallKHR, Subgroup, or Invocation"
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
            std::__cxx11::string::~string((string *)&local_608);
            DiagnosticStream::~DiagnosticStream(&local_5e8);
            return __local._4_4_;
          }
          psVar6 = ValidationState_t::context((ValidationState_t *)inst_local);
          if ((((psVar6->target_env == SPV_ENV_VULKAN_1_0) && (local_58 == 3)) &&
              (bVar2 = ValidationState_t::HasCapability
                                 ((ValidationState_t *)inst_local,CapabilitySubgroupBallotKHR),
              !bVar2)) &&
             (bVar2 = ValidationState_t::HasCapability
                                ((ValidationState_t *)inst_local,CapabilitySubgroupVoteKHR), !bVar2)
             ) {
            ValidationState_t::diag
                      (&local_7e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
            ValidationState_t::VkErrorID_abi_cxx11_
                      (&local_808,(ValidationState_t *)inst_local,0x1f0f,(char *)0x0);
            pDVar5 = DiagnosticStream::operator<<(&local_7e8,&local_808);
            errorVUID.field_2._8_8_ = spvOpcodeString(tmp_value);
            pDVar5 = DiagnosticStream::operator<<(pDVar5,(char **)((long)&errorVUID.field_2 + 8));
            pDVar5 = DiagnosticStream::operator<<
                               (pDVar5,(char (*) [118])
                                       ": in Vulkan 1.0 environment Memory Scope is can not be Subgroup without SubgroupBallotKHR or SubgroupVoteKHR declared"
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
            std::__cxx11::string::~string((string *)&local_808);
            DiagnosticStream::~DiagnosticStream(&local_7e8);
            return __local._4_4_;
          }
          if (local_58 == 6) {
            ValidationState_t::VkErrorID_abi_cxx11_
                      ((string *)local_830,(ValidationState_t *)inst_local,0x1220,(char *)0x0);
            pIVar1 = inst_local;
            pFVar7 = Instruction::function(_opcode);
            uVar3 = Function::id(pFVar7);
            pFVar7 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar3);
            std::__cxx11::string::string
                      ((string *)(errorVUID_1.field_2._M_local_buf + 8),(string *)local_830);
            std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
            function<spvtools::val::ValidateMemoryScope(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,unsigned_int)::__0,void>
                      ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_850,
                       (anon_class_32_1_293d74c2 *)((long)&errorVUID_1.field_2 + 8));
            Function::RegisterExecutionModelLimitation(pFVar7,&local_850);
            std::
            function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
            ::~function(&local_850);
            ValidateMemoryScope(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,unsigned_int)
            ::$_0::~__0((__0 *)(errorVUID_1.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_830);
          }
          if (local_58 == 2) {
            ValidationState_t::VkErrorID_abi_cxx11_
                      ((string *)local_890,(ValidationState_t *)inst_local,0x1c99,(char *)0x0);
            pIVar1 = inst_local;
            pFVar7 = Instruction::function(_opcode);
            uVar3 = Function::id(pFVar7);
            pFVar7 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar3);
            std::__cxx11::string::string((string *)&local_8d0,(string *)local_890);
            std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
            function<spvtools::val::ValidateMemoryScope(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,unsigned_int)::__1,void>
                      ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_8b0,
                       &local_8d0);
            Function::RegisterExecutionModelLimitation(pFVar7,&local_8b0);
            std::
            function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
            ::~function(&local_8b0);
            ValidateMemoryScope(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,unsigned_int)
            ::$_1::~__1((__1 *)&local_8d0);
            MVar4 = ValidationState_t::memory_model((ValidationState_t *)inst_local);
            if (MVar4 == GLSL450) {
              ValidationState_t::VkErrorID_abi_cxx11_
                        (&local_8f0,(ValidationState_t *)inst_local,0x1c98,(char *)0x0);
              std::__cxx11::string::operator=((string *)local_890,(string *)&local_8f0);
              std::__cxx11::string::~string((string *)&local_8f0);
              pIVar1 = inst_local;
              pFVar7 = Instruction::function(_opcode);
              uVar3 = Function::id(pFVar7);
              pFVar7 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar3);
              std::__cxx11::string::string((string *)&local_930,(string *)local_890);
              std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
              function<spvtools::val::ValidateMemoryScope(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,unsigned_int)::__2,void>
                        ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_910,
                         &local_930);
              Function::RegisterExecutionModelLimitation(pFVar7,&local_910);
              std::
              function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
              ::~function(&local_910);
              ValidateMemoryScope(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,unsigned_int)
              ::$_2::~__2((__2 *)&local_930);
            }
            std::__cxx11::string::~string((string *)local_890);
          }
        }
        __local._4_4_ = SPV_SUCCESS;
      }
      else {
        ValidationState_t::diag
                  (&local_410,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
        pDVar5 = DiagnosticStream::operator<<
                           (&local_410,
                            (char (*) [62])
                            "Use of device scope with VulkanKHR memory model requires the ");
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(char (*) [43])"VulkanMemoryModelDeviceScopeKHR capability");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream(&local_410);
      }
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateMemoryScope(ValidationState_t& _, const Instruction* inst,
                                 uint32_t scope) {
  const spv::Op opcode = inst->opcode();
  bool is_int32 = false, is_const_int32 = false;
  uint32_t tmp_value = 0;
  std::tie(is_int32, is_const_int32, tmp_value) = _.EvalInt32IfConst(scope);

  if (auto error = ValidateScope(_, inst, scope)) {
    return error;
  }

  if (!is_const_int32) {
    return SPV_SUCCESS;
  }

  spv::Scope value = spv::Scope(tmp_value);

  if (value == spv::Scope::QueueFamilyKHR) {
    if (_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
      return SPV_SUCCESS;
    } else {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << spvOpcodeString(opcode)
             << ": Memory Scope QueueFamilyKHR requires capability "
             << "VulkanMemoryModelKHR";
    }
  }

  if (value == spv::Scope::Device &&
      _.HasCapability(spv::Capability::VulkanMemoryModelKHR) &&
      !_.HasCapability(spv::Capability::VulkanMemoryModelDeviceScopeKHR)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Use of device scope with VulkanKHR memory model requires the "
           << "VulkanMemoryModelDeviceScopeKHR capability";
  }

  // Vulkan Specific rules
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (value != spv::Scope::Device && value != spv::Scope::Workgroup &&
        value != spv::Scope::Subgroup && value != spv::Scope::Invocation &&
        value != spv::Scope::ShaderCallKHR &&
        value != spv::Scope::QueueFamily) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4638) << spvOpcodeString(opcode)
             << ": in Vulkan environment Memory Scope is limited to Device, "
                "QueueFamily, Workgroup, ShaderCallKHR, Subgroup, or "
                "Invocation";
    } else if (_.context()->target_env == SPV_ENV_VULKAN_1_0 &&
               value == spv::Scope::Subgroup &&
               !_.HasCapability(spv::Capability::SubgroupBallotKHR) &&
               !_.HasCapability(spv::Capability::SubgroupVoteKHR)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(7951) << spvOpcodeString(opcode)
             << ": in Vulkan 1.0 environment Memory Scope is can not be "
                "Subgroup without SubgroupBallotKHR or SubgroupVoteKHR "
                "declared";
    }

    if (value == spv::Scope::ShaderCallKHR) {
      std::string errorVUID = _.VkErrorID(4640);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [errorVUID](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::RayGenerationKHR &&
                    model != spv::ExecutionModel::IntersectionKHR &&
                    model != spv::ExecutionModel::AnyHitKHR &&
                    model != spv::ExecutionModel::ClosestHitKHR &&
                    model != spv::ExecutionModel::MissKHR &&
                    model != spv::ExecutionModel::CallableKHR) {
                  if (message) {
                    *message =
                        errorVUID +
                        "ShaderCallKHR Memory Scope requires a ray tracing "
                        "execution model";
                  }
                  return false;
                }
                return true;
              });
    }

    if (value == spv::Scope::Workgroup) {
      std::string errorVUID = _.VkErrorID(7321);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [errorVUID](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::GLCompute &&
                    model != spv::ExecutionModel::TessellationControl &&
                    model != spv::ExecutionModel::TaskNV &&
                    model != spv::ExecutionModel::MeshNV &&
                    model != spv::ExecutionModel::TaskEXT &&
                    model != spv::ExecutionModel::MeshEXT) {
                  if (message) {
                    *message = errorVUID +
                               "Workgroup Memory Scope is limited to MeshNV, "
                               "TaskNV, MeshEXT, TaskEXT, TessellationControl, "
                               "and GLCompute execution model";
                  }
                  return false;
                }
                return true;
              });

      if (_.memory_model() == spv::MemoryModel::GLSL450) {
        errorVUID = _.VkErrorID(7320);
        _.function(inst->function()->id())
            ->RegisterExecutionModelLimitation(
                [errorVUID](spv::ExecutionModel model, std::string* message) {
                  if (model == spv::ExecutionModel::TessellationControl) {
                    if (message) {
                      *message =
                          errorVUID +
                          "Workgroup Memory Scope can't be used with "
                          "TessellationControl using GLSL450 Memory Model";
                    }
                    return false;
                  }
                  return true;
                });
      }
    }
  }

  // TODO(atgoo@github.com) Add checks for OpenCL and OpenGL environments.

  return SPV_SUCCESS;
}